

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O1

void __thiscall
DivideTest<long>::test_one<(libdivide::Branching)0>
          (DivideTest<long> *this,long numer,long denom,
          divider<long,_(libdivide::Branching)0> *the_divider)

{
  byte bVar1;
  sbyte sVar2;
  uint uVar3;
  long lVar4;
  char cVar5;
  string_class result;
  undefined4 *local_50;
  undefined8 local_48;
  undefined4 local_40 [4];
  
  if (denom != -1 || numer != -0x8000000000000000) {
    lVar4 = (the_divider->div).denom.magic;
    bVar1 = (the_divider->div).denom.more;
    uVar3 = bVar1 & 0x3f;
    cVar5 = (char)bVar1 >> 7;
    if (lVar4 == 0) {
      sVar2 = ((byte)uVar3 < 0x41) * ('@' - (byte)uVar3);
      lVar4 = ((long)(((ulong)((numer >> 0x3f) << sVar2) >> sVar2) + numer) >> uVar3 ^ (long)cVar5)
              - (long)cVar5;
    }
    else {
      lVar4 = SUB168(SEXT816(lVar4) * SEXT816(numer),8);
      if ((bVar1 & 0x40) != 0) {
        lVar4 = lVar4 + ((cVar5 ^ numer) - (long)cVar5);
      }
      lVar4 = (lVar4 >> uVar3) - (lVar4 >> 0x3f);
    }
    if (lVar4 != numer / denom) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Failure for ",0xc);
      local_50 = local_40;
      local_40[0] = 0x343673;
      local_48 = 3;
      std::operator<<((ostream *)&std::cerr,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::operator<<((ostream *)&std::cerr,": ");
      std::ostream::operator<<((ostream *)&std::cerr,numer);
      std::operator<<((ostream *)&std::cerr," / ");
      std::ostream::operator<<((ostream *)&std::cerr,denom);
      std::operator<<((ostream *)&std::cerr," = ");
      std::ostream::operator<<((ostream *)&std::cerr,numer / denom);
      std::operator<<((ostream *)&std::cerr,", but got ");
      std::ostream::operator<<((ostream *)&std::cerr,lVar4);
      std::operator<<((ostream *)&std::cerr,"\n");
      exit(1);
    }
  }
  return;
}

Assistant:

void test_one(T numer, T denom, const divider<T, ALGO> &the_divider) {
        // Don't crash with INT_MIN / -1
        // INT_MIN / -1 is undefined behavior in C/C++
        if (limits::is_signed && numer == (limits::min)() && denom == T(-1)) {
            return;
        }

        T expect = numer / denom;
        T result = numer / the_divider;

        if (result != expect) {
            PRINT_ERROR(F("Failure for "));
            PRINT_ERROR(testcase_name(ALGO));
            PRINT_ERROR(F(": "));
            PRINT_ERROR(numer);
            PRINT_ERROR(F(" / "));
            PRINT_ERROR(denom);
            PRINT_ERROR(F(" = "));
            PRINT_ERROR(expect);
            PRINT_ERROR(F(", but got "));
            PRINT_ERROR(result);
            PRINT_ERROR(F("\n"));
            TEST_FAIL();
        }
    }